

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::draw_arrays_instanced(NegativeTestContext *ctx)

{
  undefined *puVar1;
  bool bVar2;
  ContextType ctxType;
  deUint32 program_00;
  RenderContext *pRVar3;
  mapped_type *this;
  char *local_380;
  allocator<char> local_369;
  string local_368;
  allocator<char> local_341;
  string local_340;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  StringTemplate local_2d0;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  StringTemplate local_268;
  string local_248;
  ProgramSources local_228;
  undefined1 local_158 [8];
  ShaderProgram program;
  key_type local_80;
  undefined1 local_50 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  GLuint fbo;
  bool isES32;
  NegativeTestContext *ctx_local;
  
  pRVar3 = NegativeTestContext::getRenderContext(ctx);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(ctxType,args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
  args._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_50);
  if (bVar2) {
    local_380 = glu::getGLSLVersionDeclaration(GLSL_VERSION_320_ES);
  }
  else {
    local_380 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"GLSL_VERSION_STRING",
             (allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_50,&local_80);
  std::__cxx11::string::operator=((string *)this,local_380);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 7));
  pRVar3 = NegativeTestContext::getRenderContext(ctx);
  puVar1 = vertexShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,puVar1,&local_289);
  tcu::StringTemplate::StringTemplate(&local_268,&local_288);
  tcu::StringTemplate::specialize
            (&local_248,&local_268,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  puVar1 = fragmentShaderSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,puVar1,&local_2f1);
  tcu::StringTemplate::StringTemplate(&local_2d0,&local_2f0);
  tcu::StringTemplate::specialize
            (&local_2b0,&local_2d0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_50);
  glu::makeVtxFragSources(&local_228,&local_248,&local_2b0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_158,pRVar3,&local_228);
  glu::ProgramSources::~ProgramSources(&local_228);
  std::__cxx11::string::~string((string *)&local_2b0);
  tcu::StringTemplate::~StringTemplate(&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::__cxx11::string::~string((string *)&local_248);
  tcu::StringTemplate::~StringTemplate(&local_268);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  program_00 = glu::ShaderProgram::getProgram((ShaderProgram *)local_158);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program_00);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glVertexAttribDivisor(&ctx->super_CallLogWrapper,0,1);
  NegativeTestContext::expectError(ctx,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_318,"GL_INVALID_ENUM is generated if mode is not an accepted value.",
             &local_319);
  NegativeTestContext::beginSection(ctx,&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  glu::CallLogWrapper::glDrawArraysInstanced(&ctx->super_CallLogWrapper,0xffffffff,0,1,1);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_340,
             "GL_INVALID_VALUE is generated if count or primcount are negative.",&local_341);
  NegativeTestContext::beginSection(ctx,&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator(&local_341);
  glu::CallLogWrapper::glDrawArraysInstanced(&ctx->super_CallLogWrapper,0,0,-1,1);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glDrawArraysInstanced(&ctx->super_CallLogWrapper,0,0,1,-1);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_368,
             "GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete."
             ,&local_369);
  NegativeTestContext::beginSection(ctx,&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  glu::CallLogWrapper::glGenFramebuffers
            (&ctx->super_CallLogWrapper,1,
             (GLuint *)&args._M_t._M_impl.super__Rb_tree_header._M_node_count);
  glu::CallLogWrapper::glBindFramebuffer
            (&ctx->super_CallLogWrapper,0x8d40,
             (GLuint)args._M_t._M_impl.super__Rb_tree_header._M_node_count);
  glu::CallLogWrapper::glCheckFramebufferStatus(&ctx->super_CallLogWrapper,0x8d40);
  glu::CallLogWrapper::glDrawArraysInstanced(&ctx->super_CallLogWrapper,0,0,1,1);
  NegativeTestContext::expectError(ctx,0x506);
  glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,0);
  glu::CallLogWrapper::glDeleteFramebuffers
            (&ctx->super_CallLogWrapper,1,
             (GLuint *)&args._M_t._M_impl.super__Rb_tree_header._M_node_count);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_158);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_50);
  return;
}

Assistant:

void draw_arrays_instanced (NegativeTestContext& ctx)
{
	const bool					isES32	= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	GLuint						fbo		= 0;
	map<string, string>			args;
	args["GLSL_VERSION_STRING"]			= isES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);
	glu::ShaderProgram			program	(ctx.getRenderContext(), glu::makeVtxFragSources(tcu::StringTemplate(vertexShaderSource).specialize(args), tcu::StringTemplate(fragmentShaderSource).specialize(args)));

	ctx.glUseProgram(program.getProgram());
	ctx.expectError(GL_NO_ERROR);
	ctx.glVertexAttribDivisor(0, 1);
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_ENUM is generated if mode is not an accepted value.");
	ctx.glDrawArraysInstanced(-1, 0, 1, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if count or primcount are negative.");
	ctx.glDrawArraysInstanced(GL_POINTS, 0, -1, 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glDrawArraysInstanced(GL_POINTS, 0, 1, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete.");
	ctx.glGenFramebuffers(1, &fbo);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
	ctx.glCheckFramebufferStatus(GL_FRAMEBUFFER);
	ctx.glDrawArraysInstanced(GL_POINTS, 0, 1, 1);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, 0);
	ctx.glDeleteFramebuffers(1, &fbo);
	ctx.endSection();

	ctx.glUseProgram(0);
}